

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t _elemsize;
  int *piVar4;
  Allocator *pAVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  Mat *pMVar10;
  uint uVar11;
  size_t sVar12;
  long lVar13;
  int iVar14;
  void *pvVar15;
  void *pvVar16;
  int h;
  int _woffset;
  int _hoffset;
  int _outc;
  int _outw;
  Mat *local_150;
  Mat m;
  int _outd;
  int _outh;
  Mat m_1;
  long local_98;
  int _coffset;
  Mat m_2;
  int _doffset;
  
  iVar14 = bottom_blob->w;
  iVar9 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  iVar2 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  _outw = -1;
  _outh = -1;
  _outd = -1;
  uVar11 = bottom_blob->dims - 1;
  if (3 < uVar11) {
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    goto LAB_002664d0;
  }
  lVar7 = (long)iVar14;
  lVar13 = (long)iVar9;
  m.w = iVar14;
  switch(uVar11) {
  case 0:
    m.cstep = bottom_blob->elempack * lVar7;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    break;
  case 1:
    lVar13 = bottom_blob->elempack * lVar13;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)lVar13;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar13 * lVar7;
    break;
  case 2:
    iVar3 = bottom_blob->elempack;
    m.dims = 3;
    m.d = 1;
    lVar13 = lVar13 * lVar7;
    goto LAB_00266444;
  case 3:
    iVar3 = bottom_blob->elempack;
    m.dims = 4;
    lVar13 = lVar13 * lVar7 * (long)iVar1;
    m.d = iVar1;
LAB_00266444:
    m.c = iVar3 * iVar2;
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    m.cstep = lVar13 + 3U & 0x3ffffffffffffffc;
    m.h = iVar9;
  }
LAB_002664d0:
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  local_150 = top_blob;
  resolve_crop_roi(this,&m,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  pMVar10 = local_150;
  switch(uVar11) {
  case 0:
    if (_outw != iVar14) {
      Mat::create(local_150,_outw,_elemsize,opt->blob_allocator);
      if (pMVar10->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar10->c * pMVar10->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar10,0,_woffset);
        return 0;
      }
      if (_elemsize == 2) {
        copy_cut_border_image<unsigned_short>(bottom_blob,pMVar10,0,_woffset);
        return 0;
      }
      if (_elemsize == 1) {
        copy_cut_border_image<signed_char>(bottom_blob,pMVar10,0,_woffset);
        return 0;
      }
      return 0;
    }
    if (local_150 == bottom_blob) {
      return 0;
    }
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = local_150->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar15 = local_150->data;
        pAVar5 = local_150->allocator;
joined_r0x002666b6:
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar15 != (void *)0x0) {
            free(pvVar15);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    break;
  case 1:
    if (iVar9 != _outh || iVar14 != _outw) {
      Mat::create(local_150,_outw,_outh,_elemsize,opt->blob_allocator);
      if (pMVar10->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar10->c * pMVar10->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar10,_hoffset,_woffset);
        return 0;
      }
      if (_elemsize != 2) {
        if (_elemsize != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(bottom_blob,pMVar10,_hoffset,_woffset);
        return 0;
      }
      copy_cut_border_image<unsigned_short>(bottom_blob,pMVar10,_hoffset,_woffset);
      return 0;
    }
    if (local_150 == bottom_blob) {
      return 0;
    }
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = local_150->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar15 = local_150->data;
        pAVar5 = local_150->allocator;
        goto joined_r0x002666b6;
      }
    }
    break;
  case 2:
    if (_outc != iVar2 || (iVar9 != _outh || iVar14 != _outw)) {
      m.w = bottom_blob->w;
      m.h = bottom_blob->h;
      m.d = bottom_blob->d;
      uVar8 = bottom_blob->elemsize;
      m.data = (void *)((long)_coffset * bottom_blob->cstep * uVar8 + (long)bottom_blob->data);
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar8;
      m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
      m.c = _outc;
      m.cstep = ((long)m.d * uVar8 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar8;
      m.dims = bottom_blob->dims;
      if (iVar9 != _outh || iVar14 != _outw) {
        Mat::create(local_150,_outw,_outh,_outc,_elemsize,opt->blob_allocator);
        iVar14 = -100;
        if ((pMVar10->data != (void *)0x0) && ((long)pMVar10->c * pMVar10->cstep != 0)) {
          if (0 < _outc) {
            lVar7 = 0;
            do {
              lVar13 = (long)m.w;
              uVar8 = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
              m_1.data = (void *)(m.cstep * lVar7 * uVar8 + (long)m.data);
              m_1.refcount._0_4_ = 0;
              m_1.refcount._4_4_ = 0;
              m_1.elemsize._0_4_ = (undefined4)m.elemsize;
              m_1.elemsize._4_4_ = m.elemsize._4_4_;
              m_1.elempack = m.elempack;
              m_1.allocator = m.allocator;
              m_1.h = m.h;
              m_1.d = 1;
              m_1.c = m.d;
              m_1.w = m.w;
              m_1.dims = m.dims + -1;
              m_1.cstep = (uVar8 * m.h * lVar13 + 0xf & 0xfffffffffffffff0) / uVar8;
              if (m.dims == 4) {
                m_1.cstep = m.h * lVar13;
              }
              uVar11 = pMVar10->w;
              iVar14 = pMVar10->h;
              uVar6 = pMVar10->elemsize;
              pvVar15 = (void *)(pMVar10->cstep * lVar7 * uVar6 + (long)pMVar10->data);
              m_2.c = pMVar10->d;
              m_2.elempack = pMVar10->elempack;
              m_2.allocator = pMVar10->allocator;
              m_2.refcount._0_4_ = 0;
              m_2.refcount._4_4_ = 0;
              m_2.elemsize._0_4_ = (undefined4)uVar6;
              m_2.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
              m_2.d = 1;
              sVar12 = (long)iVar14 * (long)(int)uVar11;
              m_2.w = uVar11;
              m_2.dims = pMVar10->dims + -1;
              m_2.cstep = (uVar6 * sVar12 + 0xf & 0xfffffffffffffff0) / uVar6;
              if (pMVar10->dims == 4) {
                m_2.cstep = sVar12;
              }
              m_2.data = pvVar15;
              m_2.h = iVar14;
              if (_elemsize == 4) {
                m_2.d = 1;
                m_2.refcount._4_4_ = 0;
                m_2.refcount._0_4_ = 0;
                m_1.d = 1;
                m_1.refcount._4_4_ = 0;
                m_1.refcount._0_4_ = 0;
                copy_cut_border_image<float>(&m_1,&m_2,_hoffset,_woffset);
              }
              else if (_elemsize == 2) {
                m_2.d = 1;
                m_2.refcount._4_4_ = 0;
                m_2.refcount._0_4_ = 0;
                m_1.d = 1;
                m_1.refcount._4_4_ = 0;
                m_1.refcount._0_4_ = 0;
                copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,_woffset);
              }
              else if ((_elemsize == 1) && (pMVar10 = local_150, 0 < iVar14)) {
                pvVar16 = (void *)((long)m_1.data + uVar8 * lVar13 * (long)_hoffset + (long)_woffset
                                  );
                iVar9 = 0;
                do {
                  if ((int)uVar11 < 0xc) {
                    if (0 < (int)uVar11) {
                      uVar8 = 0;
                      do {
                        *(undefined1 *)((long)pvVar15 + uVar8) =
                             *(undefined1 *)((long)pvVar16 + uVar8);
                        uVar8 = uVar8 + 1;
                      } while (uVar11 != uVar8);
                    }
                  }
                  else {
                    memcpy(pvVar15,pvVar16,(ulong)uVar11);
                  }
                  pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar11);
                  pvVar16 = (void *)((long)pvVar16 + lVar13);
                  iVar9 = iVar9 + 1;
                  pMVar10 = local_150;
                } while (iVar9 != iVar14);
              }
              m_2.cstep = 0;
              m_2.data = (void *)0x0;
              m_2.refcount._0_4_ = 0;
              m_2.refcount._4_4_ = 0;
              m_2.elemsize._0_4_ = 0;
              m_2.elemsize._4_4_ = 0;
              m_2.elempack = 0;
              m_2.dims = 0;
              m_2.w = 0;
              m_2.h = 0;
              m_2.d = 0;
              m_2.c = 0;
              piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    if (m_1.data != (void *)0x0) {
                      free(m_1.data);
                    }
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              m_1.cstep = 0;
              m_1.data = (void *)0x0;
              m_1.refcount._0_4_ = 0;
              m_1.refcount._4_4_ = 0;
              m_1.elemsize._0_4_ = 0;
              m_1.elemsize._4_4_ = 0;
              m_1.elempack = 0;
              m_1.dims = 0;
              m_1.w = 0;
              m_1.h = 0;
              m_1.d = 0;
              m_1.c = 0;
              lVar7 = lVar7 + 1;
            } while (lVar7 < _outc);
          }
          iVar14 = 0;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outc,(void *)(ulong)(uint)_outh);
        pMVar10 = local_150;
        if (&m_1 != local_150) {
          piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = local_150->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_150->allocator == (Allocator *)0x0) {
                if (local_150->data != (void *)0x0) {
                  free(local_150->data);
                }
              }
              else {
                (*local_150->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar10->cstep = 0;
          pMVar10->data = (void *)0x0;
          pMVar10->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar10->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar10->elemsize + 4) = 0;
          pMVar10->dims = 0;
          pMVar10->w = 0;
          pMVar10->h = 0;
          pMVar10->d = 0;
          pMVar10->c = 0;
          pMVar10->data = m_1.data;
          pMVar10->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          pMVar10->elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
          pMVar10->elempack = m_1.elempack;
          pMVar10->allocator = m_1.allocator;
          pMVar10->dims = m_1.dims;
          pMVar10->w = m_1.w;
          pMVar10->h = m_1.h;
          pMVar10->d = m_1.d;
          pMVar10->c = m_1.c;
          pMVar10->cstep = m_1.cstep;
        }
        piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (pMVar10->data == (void *)0x0) {
          iVar14 = -100;
        }
        else {
          iVar14 = -100;
          if ((long)pMVar10->c * pMVar10->cstep != 0) {
            iVar14 = 0;
          }
        }
      }
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 == (int *)0x0) {
        return iVar14;
      }
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 != 0) {
        return iVar14;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar14;
      }
joined_r0x00267421:
      if (m.data != (void *)0x0) {
        m.allocator = (Allocator *)0x0;
        free(m.data);
        return iVar14;
      }
      return iVar14;
    }
    if (local_150 == bottom_blob) {
      return 0;
    }
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = local_150->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar15 = local_150->data;
        pAVar5 = local_150->allocator;
        goto joined_r0x002666b6;
      }
    }
    break;
  case 3:
    if (_outc != iVar2 || (iVar1 != _outd || (iVar9 != _outh || iVar14 != _outw))) {
      m.w = bottom_blob->w;
      m.h = bottom_blob->h;
      m.d = bottom_blob->d;
      uVar8 = bottom_blob->elemsize;
      m.data = (void *)((long)_coffset * bottom_blob->cstep * uVar8 + (long)bottom_blob->data);
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar8;
      m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
      m.c = _outc;
      m.cstep = ((long)m.d * uVar8 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar8;
      m.dims = bottom_blob->dims;
      if (iVar1 != _outd || (iVar9 != _outh || iVar14 != _outw)) {
        Mat::create(local_150,_outw,_outh,_outd,_outc,_elemsize,opt->blob_allocator);
        iVar14 = -100;
        if ((pMVar10->data != (void *)0x0) && ((long)pMVar10->c * pMVar10->cstep != 0)) {
          if (0 < _outc) {
            local_98 = 0;
            do {
              if (0 < _outd) {
                lVar7 = 0;
                do {
                  m_1.cstep = (long)m.h * (long)m.w;
                  m_1.data = (void *)((long)m.data +
                                     ((long)(int)lVar7 + (long)_doffset) *
                                     CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) * m_1.cstep +
                                     m.cstep * local_98 *
                                     CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize));
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                  m_1.elemsize._4_4_ = m.elemsize._4_4_;
                  m_1.elempack = m.elempack;
                  m_1.allocator = m.allocator;
                  m_1.w = m.w;
                  m_1.dims = 2;
                  m_1.h = m.h;
                  m_1.d = 1;
                  m_1.c = 1;
                  uVar11 = pMVar10->w;
                  sVar12 = pMVar10->elemsize;
                  iVar14 = pMVar10->h;
                  m_2.elempack = pMVar10->elempack;
                  m_2.cstep = (long)iVar14 * (long)(int)uVar11;
                  pvVar15 = (void *)((long)pMVar10->data +
                                    lVar7 * sVar12 * m_2.cstep + pMVar10->cstep * local_98 * sVar12)
                  ;
                  m_2.allocator = pMVar10->allocator;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)sVar12;
                  m_2.elemsize._4_4_ = (undefined4)(sVar12 >> 0x20);
                  m_2.w = uVar11;
                  m_2.dims = 2;
                  m_2.d = 1;
                  m_2.c = 1;
                  m_2.data = pvVar15;
                  m_2.h = iVar14;
                  if (_elemsize == 4) {
                    m_2.c = 1;
                    m_2.d = 1;
                    m_2.refcount._4_4_ = 0;
                    m_2.refcount._0_4_ = 0;
                    m_1.c = 1;
                    m_1.d = 1;
                    m_1.refcount._4_4_ = 0;
                    m_1.refcount._0_4_ = 0;
                    copy_cut_border_image<float>(&m_1,&m_2,_hoffset,_woffset);
                  }
                  else if (_elemsize == 2) {
                    m_2.c = 1;
                    m_2.d = 1;
                    m_2.refcount._4_4_ = 0;
                    m_2.refcount._0_4_ = 0;
                    m_1.c = 1;
                    m_1.d = 1;
                    m_1.refcount._4_4_ = 0;
                    m_1.refcount._0_4_ = 0;
                    copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,_woffset);
                  }
                  else if ((_elemsize == 1) && (pMVar10 = local_150, 0 < iVar14)) {
                    lVar13 = (long)m.w;
                    pvVar16 = (void *)((long)m_1.data +
                                      (long)_woffset +
                                      _hoffset * lVar13 *
                                      CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize));
                    iVar9 = 0;
                    do {
                      if ((int)uVar11 < 0xc) {
                        if (0 < (int)uVar11) {
                          uVar8 = 0;
                          do {
                            *(undefined1 *)((long)pvVar15 + uVar8) =
                                 *(undefined1 *)((long)pvVar16 + uVar8);
                            uVar8 = uVar8 + 1;
                          } while (uVar11 != uVar8);
                        }
                      }
                      else {
                        memcpy(pvVar15,pvVar16,(ulong)uVar11);
                      }
                      pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar11);
                      pvVar16 = (void *)((long)pvVar16 + lVar13);
                      iVar9 = iVar9 + 1;
                      pMVar10 = local_150;
                    } while (iVar9 != iVar14);
                  }
                  piVar4 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (m_2.allocator == (Allocator *)0x0) {
                        if (m_2.data != (void *)0x0) {
                          free(m_2.data);
                        }
                      }
                      else {
                        (*(m_2.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        if (m_1.data != (void *)0x0) {
                          free(m_1.data);
                        }
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_1.cstep = 0;
                  m_1.data = (void *)0x0;
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = 0;
                  m_1.elemsize._4_4_ = 0;
                  m_1.elempack = 0;
                  m_1.dims = 0;
                  m_1.w = 0;
                  m_1.h = 0;
                  m_1.d = 0;
                  m_1.c = 0;
                  lVar7 = lVar7 + 1;
                } while (lVar7 < _outd);
              }
              local_98 = local_98 + 1;
            } while (local_98 < _outc);
          }
          iVar14 = 0;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outd,(void *)(ulong)(uint)_outc);
        pMVar10 = local_150;
        if (&m_1 != local_150) {
          piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = local_150->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_150->allocator == (Allocator *)0x0) {
                if (local_150->data != (void *)0x0) {
                  free(local_150->data);
                }
              }
              else {
                (*local_150->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar10->cstep = 0;
          pMVar10->data = (void *)0x0;
          pMVar10->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar10->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar10->elemsize + 4) = 0;
          pMVar10->dims = 0;
          pMVar10->w = 0;
          pMVar10->h = 0;
          pMVar10->d = 0;
          pMVar10->c = 0;
          pMVar10->data = m_1.data;
          pMVar10->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          pMVar10->elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
          pMVar10->elempack = m_1.elempack;
          pMVar10->allocator = m_1.allocator;
          pMVar10->dims = m_1.dims;
          pMVar10->w = m_1.w;
          pMVar10->h = m_1.h;
          pMVar10->d = m_1.d;
          pMVar10->c = m_1.c;
          pMVar10->cstep = m_1.cstep;
        }
        piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (pMVar10->data == (void *)0x0) {
          iVar14 = -100;
        }
        else {
          iVar14 = -100;
          if ((long)pMVar10->c * pMVar10->cstep != 0) {
            iVar14 = 0;
          }
        }
      }
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 == (int *)0x0) {
        return iVar14;
      }
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 != 0) {
        return iVar14;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar14;
      }
      goto joined_r0x00267421;
    }
    if (local_150 == bottom_blob) {
      return 0;
    }
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = local_150->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar15 = local_150->data;
        pAVar5 = local_150->allocator;
        goto joined_r0x002666b6;
      }
    }
    break;
  default:
    goto LAB_00267450;
  }
  pMVar10->cstep = 0;
  pMVar10->data = (void *)0x0;
  pMVar10->refcount = (int *)0x0;
  *(undefined8 *)((long)&pMVar10->refcount + 4) = 0;
  *(undefined8 *)((long)&pMVar10->elemsize + 4) = 0;
  pMVar10->dims = 0;
  pMVar10->w = 0;
  pMVar10->h = 0;
  pMVar10->d = 0;
  pMVar10->c = 0;
  piVar4 = bottom_blob->refcount;
  pMVar10->data = bottom_blob->data;
  pMVar10->refcount = piVar4;
  pMVar10->elemsize = bottom_blob->elemsize;
  pMVar10->elempack = bottom_blob->elempack;
  pMVar10->allocator = bottom_blob->allocator;
  iVar14 = bottom_blob->w;
  iVar9 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  pMVar10->dims = bottom_blob->dims;
  pMVar10->w = iVar14;
  pMVar10->h = iVar9;
  pMVar10->d = iVar1;
  pMVar10->c = bottom_blob->c;
  pMVar10->cstep = bottom_blob->cstep;
LAB_00267450:
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}